

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.h
# Opt level: O0

TypedAttribute<Imath_3_2::Vec2<double>_> * __thiscall
Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec2<double>>>
          (Header *this,char *name)

{
  long lVar1;
  TypeExc *this_00;
  char *in_RDI;
  TypedAttribute<Imath_3_2::Vec2<double>_> *tattr;
  Attribute *attr;
  TypedAttribute<Imath_3_2::Vec2<double>_> *local_40;
  
  lVar1 = Imf_3_4::Header::operator[](in_RDI);
  if (lVar1 == 0) {
    local_40 = (TypedAttribute<Imath_3_2::Vec2<double>_> *)0x0;
  }
  else {
    local_40 = (TypedAttribute<Imath_3_2::Vec2<double>_> *)
               __dynamic_cast(lVar1,&Attribute::typeinfo,
                              &TypedAttribute<Imath_3_2::Vec2<double>>::typeinfo,0);
  }
  if (local_40 == (TypedAttribute<Imath_3_2::Vec2<double>_> *)0x0) {
    this_00 = (TypeExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::TypeExc::TypeExc(this_00,"Unexpected attribute type.");
    __cxa_throw(this_00,&Iex_3_4::TypeExc::typeinfo,Iex_3_4::TypeExc::~TypeExc);
  }
  return local_40;
}

Assistant:

const T&
Header::typedAttribute (const char name[]) const
{
    const Attribute* attr  = &(*this)[name];
    const T*         tattr = dynamic_cast<const T*> (attr);

    if (tattr == 0) throw IEX_NAMESPACE::TypeExc ("Unexpected attribute type.");

    return *tattr;
}